

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::SetPartitionedByInfo,duckdb::AlterEntryData,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
          (duckdb *this,AlterEntryData *args,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  SetPartitionedByInfo *this_00;
  AlterEntryData local_b0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_48;
  
  this_00 = (SetPartitionedByInfo *)operator_new(0x90);
  paVar1 = &local_b0.catalog.field_2;
  local_b0.catalog._M_dataplus._M_p = (args->catalog)._M_dataplus._M_p;
  paVar2 = &(args->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.catalog._M_dataplus._M_p == paVar2) {
    local_b0.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0.catalog.field_2._8_8_ = *(undefined8 *)((long)&(args->catalog).field_2 + 8);
    local_b0.catalog._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_b0.catalog._M_string_length = (args->catalog)._M_string_length;
  paVar3 = &local_b0.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar2;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  local_b0.schema._M_dataplus._M_p = (args->schema)._M_dataplus._M_p;
  paVar2 = &(args->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.schema._M_dataplus._M_p == paVar2) {
    local_b0.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0.schema.field_2._8_8_ = *(undefined8 *)((long)&(args->schema).field_2 + 8);
    local_b0.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_b0.schema._M_string_length = (args->schema)._M_string_length;
  paVar4 = &local_b0.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar2;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_b0.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar2 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p == paVar2) {
    local_b0.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0.name.field_2._8_8_ = *(undefined8 *)((long)&(args->name).field_2 + 8);
    local_b0.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_b0.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_b0.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar2;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_b0.if_not_found = args->if_not_found;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SetPartitionedByInfo::SetPartitionedByInfo
            (this_00,&local_b0,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_48);
  *(SetPartitionedByInfo **)this = this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_b0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.catalog._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}